

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

void __thiscall
boost::runtime::basic_param::usage(basic_param *this,ostream *ostr,cstring *negation_prefix_)

{
  char cVar1;
  pointer ppVar2;
  ostream *poVar3;
  _func_int **pp_Var4;
  char **ppcVar5;
  pointer *ppcVar6;
  size_type sVar7;
  pointer ppVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  char local_81;
  cstring *local_80;
  char *local_78;
  char *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_80 = negation_prefix_;
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"Parameter: ",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (ostr,(this->p_name)._M_dataplus._M_p,(this->p_name)._M_string_length);
  local_81 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_81,1);
  if ((this->p_description)._M_string_length != 0) {
    local_81 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->p_description)._M_dataplus._M_p,
                        (this->p_description)._M_string_length);
    local_81 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_81,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr," Command line formats:\n",0x17);
  ppVar8 = (this->m_cla_ids).
           super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->m_cla_ids).
           super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar2) {
    do {
      if (DAT_001cfc28 - help_prefix == (ppVar8->m_prefix)._M_string_length) {
        if (DAT_001cfc28 != help_prefix) {
          lVar9 = 0;
          do {
            pcVar10 = (char *)(help_prefix + lVar9);
            cVar1 = (ppVar8->m_prefix)._M_dataplus._M_p[lVar9];
            if (*pcVar10 != cVar1) break;
            bVar11 = ~help_prefix + DAT_001cfc28 != lVar9;
            lVar9 = lVar9 + 1;
          } while (bVar11);
          if (*pcVar10 != cVar1) goto LAB_00187dba;
        }
      }
      else {
LAB_00187dba:
        std::__ostream_insert<char,std::char_traits<char>>(ostr,"   ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (ostr,(ppVar8->m_prefix)._M_dataplus._M_p,(ppVar8->m_prefix)._M_string_length);
        if (ppVar8->m_negatable == true) {
          local_58 = (ppVar8->m_tag)._M_dataplus._M_p;
          local_50 = local_58 + (ppVar8->m_tag)._M_string_length;
          local_48 = *(undefined4 *)&local_80->m_begin;
          uStack_44 = *(undefined4 *)((long)&local_80->m_begin + 4);
          uStack_40 = *(undefined4 *)&local_80->m_end;
          uStack_3c = *(undefined4 *)((long)&local_80->m_end + 4);
          pp_Var4 = this->_vptr_basic_param;
          ppcVar6 = &local_58;
          ppcVar5 = (char **)&local_48;
        }
        else {
          local_68 = (ppVar8->m_tag)._M_dataplus._M_p;
          local_60 = local_68 + (ppVar8->m_tag)._M_string_length;
          local_78 = "";
          local_70 = "";
          pp_Var4 = this->_vptr_basic_param;
          ppcVar6 = &local_68;
          ppcVar5 = &local_78;
        }
        (*pp_Var4[7])(this,ostr,ppcVar6,ppcVar5);
        bVar11 = (this->p_has_optional_value).super_class_property<bool>.value;
        if (bVar11 == true) {
          local_81 = '[';
          std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
        }
        sVar7 = (ppVar8->m_value_separator)._M_string_length;
        if (sVar7 == 0) {
          local_81 = ' ';
          sVar7 = 1;
          pcVar10 = &local_81;
        }
        else {
          pcVar10 = (ppVar8->m_value_separator)._M_dataplus._M_p;
        }
        std::__ostream_insert<char,std::char_traits<char>>(ostr,pcVar10,sVar7);
        (*this->_vptr_basic_param[8])(this,ostr);
        if (bVar11 != false) {
          local_81 = ']';
          std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
        }
        local_81 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_81,1);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar2);
  }
  if ((this->p_env_var)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(ostr," Environment variable: ",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,(this->p_env_var)._M_dataplus._M_p,(this->p_env_var)._M_string_length);
    local_81 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_81,1);
  }
  return;
}

Assistant:

virtual void            usage( std::ostream& ostr, cstring negation_prefix_ )
    {
        ostr     << "Parameter: " << p_name << '\n';
        if( !p_description.empty() )
            ostr << ' ' << p_description << '\n';

        ostr     << " Command line formats:\n";
        BOOST_TEST_FOREACH( parameter_cla_id const&, id, cla_ids() ) {
            if( id.m_prefix == help_prefix )
                continue;

            ostr << "   " << id.m_prefix;
            if( id.m_negatable )
                cla_name_help( ostr, id.m_tag, negation_prefix_ );
            else
                cla_name_help( ostr, id.m_tag, "" );

            bool optional_value_ = false;

            if( p_has_optional_value ) {
                optional_value_ = true;
                ostr << '[';
            }

            if( id.m_value_separator.empty() )
                ostr << ' ';
            else {
                ostr << id.m_value_separator;
            }

            value_help( ostr );

            if( optional_value_ )
                ostr << ']';

            ostr << '\n';
        }
        if( !p_env_var.empty() )
            ostr << " Environment variable: " << p_env_var << '\n';
    }